

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformer.cpp
# Opt level: O2

unique_ptr<verilogAST::Module,_std::default_delete<verilogAST::Module>_> __thiscall
verilogAST::Transformer::visit
          (Transformer *this,
          unique_ptr<verilogAST::Module,_std::default_delete<verilogAST::Module>_> *node)

{
  undefined8 *puVar1;
  _Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  *p_Var2;
  _Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  _Var3;
  _Move_ctor_base<false,_std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
  *p_Var4;
  _Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  _Var5;
  long *plVar6;
  _Head_base<0UL,_verilogAST::Module_*,_false> _Var7;
  long *in_RDX;
  pointer *__ptr;
  __index_type *this_00;
  _Move_ctor_base<false,_std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
  *__rhs;
  undefined8 *puVar8;
  vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  new_body;
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  new_ports;
  _Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_b8;
  long *local_b0;
  _Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  long *local_90;
  _Head_base<0UL,_verilogAST::Module_*,_false> local_88;
  anon_class_8_1_8991fb9c local_80;
  _Variant_storage<false,_std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
  local_78;
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  local_68;
  _Variant_storage<false,_std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
  local_50;
  _Variant_storage<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
  local_40;
  
  local_68.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar1 = *(undefined8 **)(*in_RDX + 0x30);
  local_90 = in_RDX;
  local_88._M_head_impl = (Module *)this;
  for (puVar8 = *(undefined8 **)(*in_RDX + 0x28); plVar6 = local_90, puVar8 != puVar1;
      puVar8 = puVar8 + 1) {
    local_b0 = (long *)*puVar8;
    *puVar8 = 0;
    (**(code **)&(node->_M_t).
                 super___uniq_ptr_impl<verilogAST::Module,_std::default_delete<verilogAST::Module>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_verilogAST::Module_*,_std::default_delete<verilogAST::Module>_>
                 .super__Head_base<0UL,_verilogAST::Module_*,_false>._M_head_impl[2].body.
                 super__Vector_base<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
                 ._M_impl)(&local_a8,node,&local_b0);
    std::
    vector<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>,std::allocator<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>>>
    ::
    emplace_back<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>>
              ((vector<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>,std::allocator<std::unique_ptr<verilogAST::AbstractPort,std::default_delete<verilogAST::AbstractPort>>>>
                *)&local_68,
               (unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>
                *)&local_a8._M_first);
    if (local_a8 !=
        (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
         )0x0) {
      (**(code **)(*(long *)local_a8 + 0x10))();
    }
    local_a8 = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                )0x0;
    if (local_b0 != (long *)0x0) {
      (**(code **)(*local_b0 + 0x10))();
    }
    local_b0 = (long *)0x0;
  }
  std::
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ::_M_move_assign((vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
                    *)(*local_90 + 0x28),&local_68);
  p_Var2 = *(_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
             **)(*plVar6 + 0x60);
  for (this_00 = *(__index_type **)(*plVar6 + 0x58);
      (_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
       *)this_00 != p_Var2; this_00 = this_00 + 0x18) {
    std::__detail::__variant::
    _Move_ctor_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                       *)&local_40,
                      (_Move_ctor_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                       *)this_00);
    (*(code *)(node->_M_t).
              super___uniq_ptr_impl<verilogAST::Module,_std::default_delete<verilogAST::Module>_>.
              _M_t.
              super__Tuple_impl<0UL,_verilogAST::Module_*,_std::default_delete<verilogAST::Module>_>
              .super__Head_base<0UL,_verilogAST::Module_*,_false>._M_head_impl[1].name.
              _M_string_length)(&local_a8,node,&local_40);
    std::__detail::__variant::
    _Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::operator=((_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                 *)this_00,
                (_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                 *)&local_a8._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::~_Variant_storage((_Variant_storage<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                         *)&local_a8._M_first);
    std::__detail::__variant::
    _Variant_storage<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
    ::~_Variant_storage(&local_40);
    local_b8 = (((_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  *)(this_00 + 0x10))->
               super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
               ).
               super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
               .
               super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
               .
               super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
               ._M_u;
    (((_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
       *)(this_00 + 0x10))->
    super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
    ).
    super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
    .
    super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
    .
    super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
    ._M_u = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
             )0x0;
    (**(code **)(node->_M_t).
                super___uniq_ptr_impl<verilogAST::Module,_std::default_delete<verilogAST::Module>_>.
                _M_t.
                super__Tuple_impl<0UL,_verilogAST::Module_*,_std::default_delete<verilogAST::Module>_>
                .super__Head_base<0UL,_verilogAST::Module_*,_false>._M_head_impl)
              (&local_a8,node,&local_b8);
    _Var5 = local_a8;
    local_a8 = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                )0x0;
    _Var3 = (((_Move_assign_base<false,_std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
               *)(this_00 + 0x10))->
            super__Copy_assign_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
            ).
            super__Move_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
            .
            super__Copy_ctor_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
            .
            super__Variant_storage_alias<std::unique_ptr<verilogAST::Identifier>,_std::unique_ptr<verilogAST::Vector>_>
            ._M_u;
    *(_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
      *)(this_00 + 0x10) = _Var5;
    if (_Var3 != (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                  )0x0) {
      (**(code **)(*(long *)_Var3 + 0x10))();
      if (local_a8 !=
          (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
           )0x0) {
        (**(code **)(*(long *)local_a8 + 0x10))();
      }
    }
    local_a8 = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                )0x0;
    if (local_b8 !=
        (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
         )0x0) {
      (**(code **)(*(long *)local_b8 + 0x10))();
    }
    local_b8 = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
                )0x0;
  }
  local_98 = 0;
  local_a8 = (_Variadic_union<std::unique_ptr<verilogAST::Identifier,_std::default_delete<verilogAST::Identifier>_>,_std::unique_ptr<verilogAST::Vector,_std::default_delete<verilogAST::Vector>_>_>
              )0x0;
  uStack_a0 = 0;
  p_Var4 = *(_Move_ctor_base<false,_std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
             **)(*local_90 + 0x48);
  for (__rhs = *(_Move_ctor_base<false,_std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                 **)(*local_90 + 0x40); __rhs != p_Var4; __rhs = __rhs + 1) {
    std::__detail::__variant::
    _Move_ctor_base<false,_std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
    ::_Move_ctor_base((_Move_ctor_base<false,_std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                       *)&local_78,__rhs);
    local_80.this = (Transformer *)node;
    (*std::__detail::__variant::
      __gen_vtable<std::__detail::__variant::__deduce_visit_result<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/leonardt[P]verilogAST-cpp/include/verilogAST/transformer.hpp:13:9)_&&,_std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_&>
      ::_S_vtable._M_arr[local_78._M_index]._M_data)
              ((variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                *)&local_50,&local_80,
               (variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                *)&local_78);
    std::
    vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,std::default_delete<verilogAST::StructuralStatement>>,std::unique_ptr<verilogAST::Declaration,std::default_delete<verilogAST::Declaration>>>,std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,std::default_delete<verilogAST::StructuralStatement>>,std::unique_ptr<verilogAST::Declaration,std::default_delete<verilogAST::Declaration>>>>>
    ::
    emplace_back<std::variant<std::unique_ptr<verilogAST::StructuralStatement,std::default_delete<verilogAST::StructuralStatement>>,std::unique_ptr<verilogAST::Declaration,std::default_delete<verilogAST::Declaration>>>>
              ((vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,std::default_delete<verilogAST::StructuralStatement>>,std::unique_ptr<verilogAST::Declaration,std::default_delete<verilogAST::Declaration>>>,std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,std::default_delete<verilogAST::StructuralStatement>>,std::unique_ptr<verilogAST::Declaration,std::default_delete<verilogAST::Declaration>>>>>
                *)&local_a8._M_first,
               (variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
                *)&local_50);
    std::__detail::__variant::
    _Variant_storage<false,_std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
    ::~_Variant_storage(&local_50);
    std::__detail::__variant::
    _Variant_storage<false,_std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>
    ::~_Variant_storage(&local_78);
  }
  std::
  vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ::_M_move_assign((vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
                    *)(*local_90 + 0x40),&local_a8);
  _Var7._M_head_impl = local_88._M_head_impl;
  *(long *)local_88._M_head_impl = *local_90;
  *local_90 = 0;
  std::
  vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
  ::~vector((vector<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>,_std::allocator<std::variant<std::unique_ptr<verilogAST::StructuralStatement,_std::default_delete<verilogAST::StructuralStatement>_>,_std::unique_ptr<verilogAST::Declaration,_std::default_delete<verilogAST::Declaration>_>_>_>_>
             *)&local_a8._M_first);
  std::
  vector<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>,_std::allocator<std::unique_ptr<verilogAST::AbstractPort,_std::default_delete<verilogAST::AbstractPort>_>_>_>
  ::~vector(&local_68);
  return (__uniq_ptr_data<verilogAST::Module,_std::default_delete<verilogAST::Module>,_true,_true>)
         (__uniq_ptr_data<verilogAST::Module,_std::default_delete<verilogAST::Module>,_true,_true>)
         _Var7._M_head_impl;
}

Assistant:

std::unique_ptr<Module> Transformer::visit(std::unique_ptr<Module> node) {
  std::vector<std::unique_ptr<AbstractPort>> new_ports;
  for (auto&& item : node->ports) {
    new_ports.push_back(this->visit(std::move(item)));
  }
  node->ports = std::move(new_ports);
  for (auto&& param : node->parameters) {
    param.first = this->visit(std::move(param.first));
    param.second = this->visit(std::move(param.second));
  }
  std::vector<std::variant<std::unique_ptr<StructuralStatement>,
                           std::unique_ptr<Declaration>>>
      new_body;
  for (auto&& item : node->body) {
    new_body.push_back(this->visit(std::move(item)));
  }
  node->body = std::move(new_body);
  return node;
}